

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O3

bool __thiscall RigidBodyDynamics::ConstraintSet::Bind(ConstraintSet *this,Model *model)

{
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *_this;
  void *pvVar1;
  void *pvVar2;
  undefined8 uVar3;
  void *__ptr;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  Index dstRows_3;
  ulong uVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  Index dstCols;
  ulong uVar11;
  long lVar12;
  Index new_rows;
  ActualDstType actualDst_4;
  Index dstRows_1;
  int iVar13;
  Index new_rows_3;
  ActualDstType actualDst;
  Index new_rows_1;
  ulong __new_size;
  allocator_type local_89;
  value_type local_88;
  void *local_70;
  undefined8 local_68;
  void *local_60;
  undefined8 local_58;
  ConstraintSet local_50;
  value_type local_48;
  
  if (this[4] == (ConstraintSet)0x1) {
    poVar9 = std::operator<<((ostream *)&std::cerr,"Error: binding an already bound constraint set!"
                            );
    std::endl<char,std::char_traits<char>>(poVar9);
    abort();
  }
  iVar13 = (int)*(ulong *)(this + 0x70);
  __new_size = *(ulong *)(this + 0x70) & 0xffffffff;
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0xa8),
        (ulong)model->dof_count,(ulong)model->dof_count);
  if (0 < *(long *)(this + 0xb8) * *(long *)(this + 0xb0)) {
    memset(*(void **)(this + 0xa8),0,*(long *)(this + 0xb8) * *(long *)(this + 0xb0) * 8);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0xc0),(ulong)model->dof_count,
             (ulong)model->dof_count,1);
  if (0 < *(long *)(this + 200)) {
    memset(((DenseStorage<double,__1,__1,_1,_0> *)(this + 0xc0))->m_data,0,
           *(long *)(this + 200) << 3);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0xd0),__new_size,__new_size,1);
  if (0 < *(long *)(this + 0xd8)) {
    memset(((DenseStorage<double,__1,__1,_1,_0> *)(this + 0xd0))->m_data,0,
           *(long *)(this + 0xd8) << 3);
  }
  _this = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0xe0);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run(_this,__new_size,(ulong)model->dof_count);
  if (0 < *(long *)(this + 0xf0) * *(long *)(this + 0xe8)) {
    memset(*(void **)_this,0,*(long *)(this + 0xf0) * *(long *)(this + 0xe8) * 8);
  }
  uVar8 = (ulong)(model->dof_count + iVar13);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0xf8),uVar8,uVar8);
  if (0 < *(long *)(this + 0x108) * *(long *)(this + 0x100)) {
    memset(*(void **)(this + 0xf8),0,*(long *)(this + 0x108) * *(long *)(this + 0x100) * 8);
  }
  uVar8 = (ulong)(model->dof_count + iVar13);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x110),uVar8,uVar8,1);
  if (0 < *(long *)(this + 0x118)) {
    memset(((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x110))->m_data,0,
           *(long *)(this + 0x118) << 3);
  }
  uVar8 = (ulong)(iVar13 + model->dof_count);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x120),uVar8,uVar8,1);
  if (0 < *(long *)(this + 0x128)) {
    memset(((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x120))->m_data,0,
           *(long *)(this + 0x128) << 3);
  }
  local_48.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = (double)_this;
  Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  HouseholderQR<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_88,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_48);
  pvVar1 = *(void **)(this + 0x130);
  *(double *)(this + 0x130) =
       local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0];
  dVar6 = *(double *)(this + 0x138);
  dVar7 = *(double *)(this + 0x140);
  *(double *)(this + 0x138) =
       local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1];
  *(double *)(this + 0x140) =
       local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[2];
  pvVar2 = *(void **)(this + 0x148);
  *(void **)(this + 0x148) = local_70;
  uVar3 = *(undefined8 *)(this + 0x150);
  *(undefined8 *)(this + 0x150) = local_68;
  __ptr = *(void **)(this + 0x158);
  *(void **)(this + 0x158) = local_60;
  uVar4 = *(undefined8 *)(this + 0x160);
  *(undefined8 *)(this + 0x160) = local_58;
  this[0x168] = local_50;
  local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = (double)pvVar1;
  local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = dVar6;
  local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = dVar7;
  local_70 = pvVar2;
  local_68 = uVar3;
  local_60 = __ptr;
  local_58 = uVar4;
  free(__ptr);
  free(local_70);
  free((void *)local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0]);
  uVar8 = CONCAT44(0,model->dof_count);
  if ((*(ulong *)(this + 0x178) != uVar8) || (uVar11 = uVar8, *(ulong *)(this + 0x180) != uVar8)) {
    if ((uVar8 != 0) &&
       (auVar5._8_8_ = 0, auVar5._0_8_ = uVar8,
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar5,0) < uVar8))
    goto LAB_0010fe9b;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x170),uVar8 * uVar8,uVar8,uVar8);
    uVar8 = *(ulong *)(this + 0x178);
    uVar11 = *(ulong *)(this + 0x180);
  }
  if (0 < (long)(uVar11 * uVar8)) {
    memset(((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x170))->m_data,0,uVar11 * uVar8 * 8);
  }
  uVar8 = (ulong)model->dof_count;
  lVar12 = *(long *)(this + 0xe8);
  if ((*(ulong *)(this + 400) != uVar8) || (*(long *)(this + 0x198) != lVar12)) {
    if ((lVar12 != 0 && uVar8 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar12),0) < (long)uVar8
       )) goto LAB_0010fe9b;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x188),lVar12 * uVar8,uVar8,lVar12);
    uVar8 = *(ulong *)(this + 400);
    lVar12 = *(long *)(this + 0x198);
  }
  if (0 < (long)(lVar12 * uVar8)) {
    memset(((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x188))->m_data,0,lVar12 * uVar8 * 8);
  }
  uVar8 = (ulong)model->dof_count;
  lVar12 = uVar8 - *(long *)(this + 0xe8);
  if ((*(ulong *)(this + 0x1a8) != uVar8) || (*(long *)(this + 0x1b0) != lVar12)) {
    if ((lVar12 != 0 && uVar8 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar12),0) < (long)uVar8
       )) {
LAB_0010fe9b:
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = std::operator<<;
      __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x1a0),lVar12 * uVar8,uVar8,lVar12);
    uVar8 = *(ulong *)(this + 0x1a8);
    lVar12 = *(long *)(this + 0x1b0);
  }
  if (0 < (long)(lVar12 * uVar8)) {
    memset(((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x1a0))->m_data,0,lVar12 * uVar8 * 8);
  }
  uVar8 = (ulong)model->dof_count;
  if (*(ulong *)(this + 0x1c0) != uVar8) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x1b8),uVar8,1);
    uVar8 = *(ulong *)(this + 0x1c0);
  }
  if (0 < (long)uVar8) {
    memset(*(void **)(this + 0x1b8),0,uVar8 << 3);
  }
  uVar8 = (ulong)model->dof_count;
  if (*(ulong *)(this + 0x1d0) != uVar8) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x1c8),uVar8,1);
    uVar8 = *(ulong *)(this + 0x1d0);
  }
  if (0 < (long)uVar8) {
    memset(*(void **)(this + 0x1c8),0,uVar8 << 3);
  }
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x1d8),__new_size,__new_size
       );
  if (0 < *(long *)(this + 0x1e8) * *(long *)(this + 0x1e0)) {
    memset(*(void **)(this + 0x1d8),0,*(long *)(this + 0x1e8) * *(long *)(this + 0x1e0) * 8);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x1f0),__new_size,__new_size,1);
  if (0 < *(long *)(this + 0x1f8)) {
    memset(((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x1f0))->m_data,0,
           *(long *)(this + 0x1f8) << 3);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x200),(ulong)model->dof_count,
             (ulong)model->dof_count,1);
  if (0 < *(long *)(this + 0x208)) {
    memset(((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x200))->m_data,0,
           *(long *)(this + 0x208) << 3);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x210),(ulong)model->dof_count,
             (ulong)model->dof_count,1);
  if (0 < *(long *)(this + 0x218)) {
    memset(((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x210))->m_data,0,
           *(long *)(this + 0x218) << 3);
  }
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(this + 0x220),
             __new_size,(value_type *)&Math::SpatialVectorZero);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(this + 0x238),
             ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
             (value_type *)&Math::SpatialVectorZero);
  local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::resize
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(this + 0x250),__new_size,&local_88);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)&local_88,
             ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
             (value_type *)&Math::SpatialVectorZero,(allocator_type *)&local_48);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator=
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(this + 0x268),
             (vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)&local_88);
  if ((void *)local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0] != (void *)0x0) {
    free((void *)local_88.super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [0]);
  }
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)&local_88,
             ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
             (value_type *)&Math::SpatialVectorZero,(allocator_type *)&local_48);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator=
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(this + 0x280),
             (vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)&local_88);
  if ((void *)local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0] != (void *)0x0) {
    free((void *)local_88.super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [0]);
  }
  lVar12 = ((long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  if (*(long *)(this + 0x2a0) != lVar12) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x298),lVar12,1);
    lVar12 = *(long *)(this + 0x2a0);
  }
  if (0 < lVar12) {
    memset(*(void **)(this + 0x298),0,lVar12 << 3);
  }
  std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::vector
            ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)&local_88,
             ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
             (value_type *)Math::SpatialMatrixIdentity,(allocator_type *)&local_48);
  std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator=
            ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)(this + 0x2a8),
             (vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)&local_88);
  if ((void *)local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0] != (void *)0x0) {
    free((void *)local_88.super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [0]);
  }
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)&local_88,
             ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
             (value_type *)&Math::SpatialVectorZero,(allocator_type *)&local_48);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator=
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(this + 0x2c0),
             (vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)&local_88);
  if ((void *)local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0] != (void *)0x0) {
    free((void *)local_88.super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [0]);
  }
  lVar12 = ((long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  if (*(long *)(this + 0x2e0) != lVar12) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x2d8),lVar12,1);
    lVar12 = *(long *)(this + 0x2e0);
  }
  if (0 < lVar12) {
    memset(*(void **)(this + 0x2d8),0,lVar12 << 3);
  }
  local_48.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  local_48.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  local_48.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)&local_88,
             ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,&local_48,
             &local_89);
  pvVar1 = *(void **)(this + 0x2e8);
  lVar12 = *(long *)(this + 0x2f8);
  *(double *)(this + 0x2e8) =
       local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0];
  *(double *)(this + 0x2f0) =
       local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1];
  *(double *)(this + 0x2f8) =
       local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[2];
  local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  if ((pvVar1 != (void *)0x0) &&
     (operator_delete(pvVar1,lVar12 - (long)pvVar1),
     (void *)local_88.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0] != (void *)0x0)) {
    operator_delete((void *)local_88.super_Vector3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[0],
                    (long)local_88.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2] -
                    (long)local_88.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0]);
  }
  this[4] = (ConstraintSet)0x1;
  return true;
}

Assistant:

bool ConstraintSet::Bind (const Model &model) {
	assert (bound == false);

	if (bound) {
		std::cerr << "Error: binding an already bound constraint set!" << std::endl;
		abort();
	}
	unsigned int n_constr = size();

	H.conservativeResize (model.dof_count, model.dof_count);
	H.setZero();
	C.conservativeResize (model.dof_count);
	C.setZero();
	gamma.conservativeResize (n_constr);
	gamma.setZero();
	G.conservativeResize (n_constr, model.dof_count);
	G.setZero();
	A.conservativeResize (model.dof_count + n_constr, model.dof_count + n_constr);
	A.setZero();
	b.conservativeResize (model.dof_count + n_constr);
	b.setZero();
	x.conservativeResize (model.dof_count + n_constr);
	x.setZero();

#ifdef RBDL_USE_SIMPLE_MATH
	GT_qr = SimpleMath::HouseholderQR<Math::MatrixNd> (G.transpose());
#else
	GT_qr = Eigen::HouseholderQR<Math::MatrixNd> (G.transpose());
#endif
	GT_qr_Q = MatrixNd::Zero (model.dof_count, model.dof_count);
	Y = MatrixNd::Zero (model.dof_count, G.rows());
	Z = MatrixNd::Zero (model.dof_count, model.dof_count - G.rows());
	qddot_y = VectorNd::Zero (model.dof_count);
	qddot_z = VectorNd::Zero (model.dof_count);

	K.conservativeResize (n_constr, n_constr);
	K.setZero();
	a.conservativeResize (n_constr);
	a.setZero();
	QDDot_t.conservativeResize (model.dof_count);
	QDDot_t.setZero();
	QDDot_0.conservativeResize (model.dof_count);
	QDDot_0.setZero();
	f_t.resize (n_constr, SpatialVectorZero);
	f_ext_constraints.resize (model.mBodies.size(), SpatialVectorZero);
	point_accel_0.resize (n_constr, Vector3d::Zero());

	d_pA = std::vector<SpatialVector> (model.mBodies.size(), SpatialVectorZero);
	d_a = std::vector<SpatialVector> (model.mBodies.size(), SpatialVectorZero);
	d_u = VectorNd::Zero (model.mBodies.size());

	d_IA = std::vector<SpatialMatrix> (model.mBodies.size(), SpatialMatrixIdentity);
	d_U = std::vector<SpatialVector> (model.mBodies.size(), SpatialVectorZero);
	d_d = VectorNd::Zero (model.mBodies.size());

	d_multdof3_u = std::vector<Math::Vector3d> (model.mBodies.size(), Math::Vector3d::Zero());

	bound = true;

	return bound;
}